

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O1

double sptk::AddInLogSpace(double log_x,double log_y)

{
  double dVar1;
  double dVar2;
  
  if ((log_x != log_y) || (NAN(log_x) || NAN(log_y))) {
    dVar1 = log_y;
    if (log_y <= log_x) {
      dVar1 = log_x;
      log_x = log_y;
    }
    if (-34.0 <= log_x - dVar1) {
      dVar2 = exp(log_x - dVar1);
      dVar2 = log1p(dVar2);
      dVar1 = dVar1 + dVar2;
    }
  }
  else {
    dVar1 = log_x + 0.693147180559945;
  }
  return dVar1;
}

Assistant:

double AddInLogSpace(double log_x, double log_y) {
  if (log_x == log_y) return log_x + kLogTwo;
  const double smaller((log_x < log_y) ? log_x : log_y);
  const double greater((log_x < log_y) ? log_y : log_x);
  const double diff(smaller - greater);
  if (diff < kThresholdOfInformationLossInLogSpace) return greater;
  return greater + std::log1p(std::exp(diff));
}